

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void crnlib::end_nonzero_run(uint *size,uint len,vector<unsigned_short> *codes)

{
  uint uVar1;
  ushort local_26;
  ushort local_24;
  unsigned_short local_22;
  vector<unsigned_short> *local_20;
  vector<unsigned_short> *codes_local;
  uint *puStack_10;
  uint len_local;
  uint *size_local;
  
  if (*size != 0) {
    local_20 = codes;
    codes_local._4_4_ = len;
    puStack_10 = size;
    if (*size < 3) {
      while (uVar1 = *puStack_10, *puStack_10 = uVar1 - 1, uVar1 != 0) {
        local_22 = (unsigned_short)codes_local._4_4_;
        vector<unsigned_short>::push_back(local_20,&local_22);
      }
    }
    else if (*size < 7) {
      local_24 = ((short)*size + -3) * 0x100 | 0x13;
      vector<unsigned_short>::push_back(codes,&local_24);
    }
    else {
      local_26 = ((short)*size + -7) * 0x100 | 0x14;
      vector<unsigned_short>::push_back(codes,&local_26);
    }
    *puStack_10 = 0;
  }
  return;
}

Assistant:

static inline void end_nonzero_run(uint& size, uint len, crnlib::vector<uint16>& codes)
    {
        if (!size)
        {
            return;
        }

        if (size < cSmallMinNonZeroRunSize)
        {
            while (size--)
            {
                codes.push_back(static_cast<uint16>(len));
            }
        }
        else if (size <= cSmallMaxNonZeroRunSize)
        {
            codes.push_back(static_cast<uint16>(cSmallRepeatCode | ((size - cSmallMinNonZeroRunSize) << 8)));
        }
        else
        {
            CRNLIB_ASSERT((size >= cLargeMinNonZeroRunSize) && (size <= cLargeMaxNonZeroRunSize));
            codes.push_back(static_cast<uint16>(cLargeRepeatCode | ((size - cLargeMinNonZeroRunSize) << 8)));
        }

        size = 0;
    }